

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtooltip.cpp
# Opt level: O1

void __thiscall QTipLabel::restartExpireTimer(QTipLabel *this,int msecDisplayTime)

{
  FocusPolicy FVar1;
  long lVar2;
  long in_FS_OFFSET;
  bool bVar3;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QLabel).super_QFrame.super_QWidget.field_0x8;
  if ((*(byte *)(lVar2 + 0x340) & 0x10) == 0) {
    bVar3 = false;
  }
  else {
    bVar3 = true;
    if ((*(int *)(lVar2 + 0x328) == 0) && ((*(byte *)(lVar2 + 0x32c) & 3) == 0)) {
      FVar1 = QWidget::focusPolicy(*(QWidget **)(lVar2 + 8));
      bVar3 = FVar1 != NoFocus;
    }
  }
  if (bVar3) {
    QWidgetTextControl::toPlainText(&local_48,*(QWidgetTextControl **)(lVar2 + 0x2f8));
  }
  else {
    QLabel::text(&local_48,&this->super_QLabel);
  }
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  lVar2 = 100;
  if (100 < local_48.d.size) {
    lVar2 = local_48.d.size;
  }
  if (msecDisplayTime < 1) {
    msecDisplayTime = (int)lVar2 * 0x28 + 6000;
  }
  QBasicTimer::start(&this->expireTimer,(long)msecDisplayTime * 1000000,1,this);
  QBasicTimer::stop();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTipLabel::restartExpireTimer(int msecDisplayTime)
{
    Q_D(const QLabel);
    const qsizetype textLength = d->needTextControl() ? d->control->toPlainText().size() : text().size();
    qsizetype time = 10000 + 40 * qMax(0, textLength - 100);
    if (msecDisplayTime > 0)
        time = msecDisplayTime;
    expireTimer.start(time, this);
    hideTimer.stop();
}